

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_trust(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *pCVar5;
  char arg2 [4608];
  char arg1 [4608];
  char local_2418 [4608];
  char local_1218 [4608];
  
  pcVar4 = one_argument(argument,local_1218);
  one_argument(pcVar4,local_2418);
  if (((local_1218[0] == '\0') || (local_2418[0] == '\0')) ||
     (bVar1 = is_number(local_2418), !bVar1)) {
    pcVar4 = "Syntax: trust <char> <level>.\n\r";
  }
  else {
    pCVar5 = get_char_world(ch,local_1218);
    if (pCVar5 == (CHAR_DATA *)0x0) {
      pcVar4 = "That player is not here.\n\r";
    }
    else {
      uVar2 = atoi(local_2418);
      if (uVar2 < 0x3d) {
        iVar3 = get_trust(ch);
        if ((int)uVar2 <= iVar3) {
          pCVar5->trust = (short)uVar2;
          return;
        }
        pcVar4 = "Limited to your trust.\n\r";
      }
      else {
        pcVar4 = "Level must be 0 (reset) or 1 to 60.\n\r";
      }
    }
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_trust(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int level;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0' || !is_number(arg2))
	{
		send_to_char("Syntax: trust <char> <level>.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("That player is not here.\n\r", ch);
		return;
	}

	level = atoi(arg2);

	if (level < 0 || level > 60)
	{
		send_to_char("Level must be 0 (reset) or 1 to 60.\n\r", ch);
		return;
	}

	if (level > get_trust(ch))
	{
		send_to_char("Limited to your trust.\n\r", ch);
		return;
	}

	victim->trust = level;
}